

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  Settings *this;
  string *psVar6;
  int iVar7;
  allocator local_81;
  char **local_80;
  int local_74;
  string local_70;
  string local_50;
  
  iVar7 = 0;
  local_80 = argv;
  local_74 = argc;
LAB_00115c8b:
  if (local_74 <= iVar7) {
    bVar2 = Settings::bundleLibs();
    if ((bVar2) || (iVar7 = Settings::fileToFixAmount(), 0 < iVar7)) {
      std::operator<<((ostream *)&std::cout,"* Collecting dependencies");
      fflush(_stdout);
      iVar7 = Settings::fileToFixAmount();
      this = (Settings *)0x0;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar5 = extraout_RDX;
      for (; iVar7 != (int)this; this = (Settings *)(ulong)((int)this + 1)) {
        Settings::fileToFix_abi_cxx11_(&local_70,this,(int)uVar5);
        collectDependencies(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        uVar5 = extraout_RDX_00;
      }
      collectSubDependencies();
      doneWithDeps_go();
      return 0;
    }
LAB_0011602b:
    showHelp();
    exit(0);
  }
  __s1 = local_80[iVar7];
  cVar1 = *__s1;
  psVar6 = &local_70;
  if ((((cVar1 == '-') && (__s1[1] == 'x')) && (__s1[2] == '\0')) ||
     (iVar3 = strcmp(__s1,"--fix-file"), iVar3 == 0)) {
    std::__cxx11::string::string((string *)&local_70,local_80[(long)iVar7 + 1],&local_81);
    Settings::addFileToFix(&local_70);
    goto LAB_00115f4b;
  }
  if ((((cVar1 == '-') && (__s1[1] == 'b')) && (__s1[2] == '\0')) ||
     (iVar3 = strcmp(__s1,"--bundle-deps"), iVar3 == 0)) {
    Settings::bundleLibs(true);
    goto LAB_00115f50;
  }
  if ((((cVar1 == '-') && (__s1[1] == 'p')) && (__s1[2] == '\0')) ||
     (iVar3 = strcmp(__s1,"--install-path"), iVar3 == 0)) {
    std::__cxx11::string::string((string *)&local_70,local_80[(long)iVar7 + 1],&local_81);
    Settings::inside_lib_path(&local_70);
LAB_00115f4b:
    iVar7 = iVar7 + 1;
    std::__cxx11::string::~string((string *)psVar6);
  }
  else {
    if ((((cVar1 == '-') && (__s1[1] == 'i')) && (__s1[2] == '\0')) ||
       (iVar3 = strcmp(__s1,"--ignore"), iVar3 == 0)) {
      std::__cxx11::string::string
                ((string *)&local_50,local_80[(long)iVar7 + 1],(allocator *)&local_70);
      Settings::ignore_prefix(&local_50);
      psVar6 = &local_50;
      goto LAB_00115f4b;
    }
    if ((((cVar1 == '-') && (__s1[1] == 'd')) && (__s1[2] == '\0')) ||
       (iVar3 = strcmp(__s1,"--dest-dir"), iVar3 == 0)) {
      std::__cxx11::string::string((string *)&local_70,local_80[(long)iVar7 + 1],&local_81);
      Settings::destFolder(&local_70);
      goto LAB_00115f4b;
    }
    iVar3 = strcmp(__s1,"-of");
    if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"--overwrite-files"), iVar3 == 0)) {
      Settings::canOverwriteFiles(true);
    }
    else {
      iVar3 = strcmp(__s1,"-od");
      if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"--overwrite-dir"), iVar3 == 0)) {
        Settings::canOverwriteDir(true);
      }
      else {
        iVar3 = strcmp(__s1,"-cd");
        if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"--create-dir"), iVar3 != 0)) {
          iVar3 = strcmp(__s1,"-ns");
          if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"--no-codesign"), iVar3 != 0)) {
            if ((((cVar1 != '-') || (__s1[1] != 'h')) || (__s1[2] != '\0')) &&
               (iVar3 = strcmp(__s1,"--help"), iVar3 != 0)) {
              if ((((cVar1 == '-') && (__s1[1] == 's')) && (__s1[2] == '\0')) ||
                 (iVar3 = strcmp(__s1,"--search-path"), iVar3 == 0)) {
                std::__cxx11::string::string
                          ((string *)&local_70,local_80[(long)iVar7 + 1],&local_81);
                Settings::addSearchPath(&local_70);
                goto LAB_00115f4b;
              }
              if (0 < iVar7) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown flag ");
                poVar4 = std::operator<<(poVar4,local_80[iVar7]);
                poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
                std::endl<char,std::char_traits<char>>(poVar4);
                showHelp();
                exit(1);
              }
              goto LAB_00115f50;
            }
            goto LAB_0011602b;
          }
          Settings::canCodesign(false);
          goto LAB_00115f50;
        }
      }
      Settings::canCreateDir(true);
    }
  }
LAB_00115f50:
  iVar7 = iVar7 + 1;
  goto LAB_00115c8b;
}

Assistant:

int main (int argc, char * const argv[])
{
    
    // parse arguments    
    for(int i=0; i<argc; i++)
    {
        if(strcmp(argv[i],"-x")==0 or strcmp(argv[i],"--fix-file")==0)
        {
            i++;
            Settings::addFileToFix(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-b")==0 or strcmp(argv[i],"--bundle-deps")==0)
        {
            Settings::bundleLibs(true);
            continue;    
        }
        else if(strcmp(argv[i],"-p")==0 or strcmp(argv[i],"--install-path")==0)
        {
            i++;
            Settings::inside_lib_path(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-i")==0 or strcmp(argv[i],"--ignore")==0)
        {
            i++;
            Settings::ignore_prefix(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-d")==0 or strcmp(argv[i],"--dest-dir")==0)
        {
            i++;
            Settings::destFolder(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-of")==0 or strcmp(argv[i],"--overwrite-files")==0)
        {
            Settings::canOverwriteFiles(true);
            continue;    
        }
        else if(strcmp(argv[i],"-od")==0 or strcmp(argv[i],"--overwrite-dir")==0)
        {
            Settings::canOverwriteDir(true);
            Settings::canCreateDir(true);
            continue;    
        }
        else if(strcmp(argv[i],"-cd")==0 or strcmp(argv[i],"--create-dir")==0)
        {
            Settings::canCreateDir(true);
            continue;    
        }
        else if(strcmp(argv[i],"-ns")==0 or strcmp(argv[i],"--no-codesign")==0)
        {
            Settings::canCodesign(false);
            continue;
        }
        else if(strcmp(argv[i],"-h")==0 or strcmp(argv[i],"--help")==0)
        {
            showHelp();
            exit(0);    
        }
        if(strcmp(argv[i],"-s")==0 or strcmp(argv[i],"--search-path")==0)
        {
            i++;
            Settings::addSearchPath(argv[i]);
            continue;
        }
        else if(i>0)
        {
            // if we meet an unknown flag, abort
            // ignore first one cause it's usually the path to the executable
            std::cerr << "Unknown flag " << argv[i] << std::endl << std::endl;
            showHelp();
            exit(1);
        }
    }
    
    if(not Settings::bundleLibs() and Settings::fileToFixAmount()<1)
    {
        showHelp();
        exit(0);
    }
    
    std::cout << "* Collecting dependencies"; fflush(stdout);
    
    const int amount = Settings::fileToFixAmount();
    for(int n=0; n<amount; n++)
        collectDependencies(Settings::fileToFix(n));
    
    collectSubDependencies();
    doneWithDeps_go();
    
    return 0;
}